

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O3

void chan_writeb0(opl_channel *channel,Bit8u data)

{
  opl_slot *poVar1;
  opl_channel *poVar2;
  opl_channel *poVar3;
  Bit8u BVar4;
  short sVar5;
  byte bVar6;
  uint uVar7;
  
  if ((channel->chip->newm == '\0') || (channel->chtype != '\x02')) {
    uVar7 = (data & 3) << 8 | (uint)(byte)channel->f_num;
    channel->f_num = (Bit16u)uVar7;
    bVar6 = data >> 2 & 7;
    channel->block = bVar6;
    channel->ksv = (uVar7 >> ((byte)(9 - channel->chip->nts) & 0x1f) & 1) != 0 | bVar6 * '\x02';
    poVar1 = channel->slots[0];
    sVar5 = (ushort)poVar1->channel->block * 0x20 + (ushort)""[poVar1->channel->f_num >> 6] * 4 +
            -0x100;
    BVar4 = (Bit8u)sVar5;
    if (sVar5 < 1) {
      BVar4 = '\0';
    }
    poVar1->eg_ksl = BVar4;
    poVar2 = channel->slots[1]->channel;
    sVar5 = (ushort)poVar2->block * 0x20 + (ushort)""[poVar2->f_num >> 6] * 4 + -0x100;
    if (sVar5 < 1) {
      sVar5 = 0;
    }
    channel->slots[1]->eg_ksl = (Bit8u)sVar5;
    envelope_update_rate(poVar1);
    envelope_update_rate(channel->slots[1]);
    if ((channel->chip->newm != '\0') && (channel->chtype == '\x01')) {
      poVar2 = channel->pair;
      poVar2->f_num = channel->f_num;
      poVar2->block = channel->block;
      poVar2->ksv = channel->ksv;
      poVar1 = poVar2->slots[0];
      sVar5 = (ushort)poVar1->channel->block * 0x20 + (ushort)""[poVar1->channel->f_num >> 6] * 4 +
              -0x100;
      BVar4 = (Bit8u)sVar5;
      if (sVar5 < 1) {
        BVar4 = '\0';
      }
      poVar1->eg_ksl = BVar4;
      poVar3 = poVar2->slots[1]->channel;
      sVar5 = (ushort)poVar3->block * 0x20 + (ushort)""[poVar3->f_num >> 6] * 4 + -0x100;
      BVar4 = (Bit8u)sVar5;
      if (sVar5 < 1) {
        BVar4 = '\0';
      }
      poVar2->slots[1]->eg_ksl = BVar4;
      envelope_update_rate(poVar1);
      envelope_update_rate(channel->pair->slots[1]);
      return;
    }
  }
  return;
}

Assistant:

void chan_writeb0(opl_channel *channel, Bit8u data) {
	if (channel->chip->newm && channel->chtype == ch_4op2) {
		return;
	}
	channel->f_num = (channel->f_num & 0xff) | ((data & 0x03) << 8);
	channel->block = (data >> 2) & 0x07;
	channel->ksv = (channel->block << 1) | ((channel->f_num >> (0x09 - channel->chip->nts)) & 0x01);
	envelope_update_ksl(channel->slots[0]);
	envelope_update_ksl(channel->slots[1]);
	envelope_update_rate(channel->slots[0]);
	envelope_update_rate(channel->slots[1]);
	if (channel->chip->newm && channel->chtype == ch_4op) {
		channel->pair->f_num = channel->f_num;
		channel->pair->block = channel->block;
		channel->pair->ksv = channel->ksv;
		envelope_update_ksl(channel->pair->slots[0]);
		envelope_update_ksl(channel->pair->slots[1]);
		envelope_update_rate(channel->pair->slots[0]);
		envelope_update_rate(channel->pair->slots[1]);
	}
}